

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::_check_next_flags(Tree *this,size_t node,type_bits f)

{
  NodeType_e NVar1;
  Location loc;
  Location loc_00;
  Location loc_01;
  Location loc_02;
  Location loc_03;
  Location loc_04;
  Location loc_05;
  Location loc_06;
  Location loc_07;
  Location loc_08;
  Location loc_09;
  bool bVar2;
  error_flags eVar3;
  NodeData *pNVar4;
  ulong in_RDX;
  size_t pid_1;
  size_t pid;
  type_bits o;
  NodeData *n;
  size_t in_stack_fffffffffffffd88;
  Tree *in_stack_fffffffffffffd90;
  char *in_stack_fffffffffffffd98;
  Location *in_stack_fffffffffffffda0;
  size_t in_stack_fffffffffffffdd8;
  Tree *in_stack_fffffffffffffde0;
  size_t in_stack_fffffffffffffdf0;
  Tree *in_stack_fffffffffffffdf8;
  char *in_stack_fffffffffffffe00;
  Location *in_stack_fffffffffffffe08;
  size_t in_stack_fffffffffffffe10;
  size_t local_1e0;
  Tree *pTStack_1d8;
  char *local_1d0;
  Location *pLStack_1c8;
  size_t local_1b8;
  Tree *pTStack_1b0;
  char *local_1a8;
  Location *pLStack_1a0;
  size_t local_190;
  Tree *pTStack_188;
  char *local_180;
  Location *pLStack_178;
  size_t local_168;
  Tree *pTStack_160;
  char *local_158;
  Location *pLStack_150;
  size_t local_140;
  Tree *pTStack_138;
  char *local_130;
  Location *pLStack_128;
  size_t local_118;
  Tree *pTStack_110;
  char *local_108;
  Location *pLStack_100;
  size_t local_f0;
  Tree *pTStack_e8;
  char *local_e0;
  Location *pLStack_d8;
  size_t local_c8;
  Tree *pTStack_c0;
  char *local_b8;
  Location *pLStack_b0;
  size_t local_a0;
  Tree *pTStack_98;
  char *local_90;
  Location *pLStack_88;
  
  pNVar4 = _p(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  NVar1 = (pNVar4->m_type).type;
  if ((in_RDX & 4) == 0) {
    if ((in_RDX & 8) != 0) {
      if ((in_RDX & 4) != 0) {
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          trap_instruction();
        }
        Location::Location(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                           (size_t)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
        loc_03.super_LineCol.line = (size_t)in_stack_fffffffffffffdf8;
        loc_03.super_LineCol.offset = in_stack_fffffffffffffdf0;
        loc_03.super_LineCol.col = (size_t)in_stack_fffffffffffffe00;
        loc_03.name.str = (char *)in_stack_fffffffffffffe08;
        loc_03.name.len = in_stack_fffffffffffffe10;
        error<72ul>((char (*) [72])in_stack_fffffffffffffde0,loc_03);
        in_stack_fffffffffffffd88 = local_140;
        in_stack_fffffffffffffd90 = pTStack_138;
        in_stack_fffffffffffffd98 = local_130;
        in_stack_fffffffffffffda0 = pLStack_128;
      }
      if ((in_RDX & 1) != 0) {
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          trap_instruction();
        }
        Location::Location(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                           (size_t)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
        loc_04.super_LineCol.line = (size_t)in_stack_fffffffffffffdf8;
        loc_04.super_LineCol.offset = in_stack_fffffffffffffdf0;
        loc_04.super_LineCol.col = (size_t)in_stack_fffffffffffffe00;
        loc_04.name.str = (char *)in_stack_fffffffffffffe08;
        loc_04.name.len = in_stack_fffffffffffffe10;
        error<72ul>((char (*) [72])in_stack_fffffffffffffde0,loc_04);
        in_stack_fffffffffffffd88 = local_168;
        in_stack_fffffffffffffd90 = pTStack_160;
        in_stack_fffffffffffffd98 = local_158;
        in_stack_fffffffffffffda0 = pLStack_150;
      }
      if ((NVar1 & MAP) != NOTYPE) {
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          trap_instruction();
        }
        Location::Location(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                           (size_t)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
        loc_05.super_LineCol.line = (size_t)in_stack_fffffffffffffdf8;
        loc_05.super_LineCol.offset = in_stack_fffffffffffffdf0;
        loc_05.super_LineCol.col = (size_t)in_stack_fffffffffffffe00;
        loc_05.name.str = (char *)in_stack_fffffffffffffe08;
        loc_05.name.len = in_stack_fffffffffffffe10;
        error<72ul>((char (*) [72])in_stack_fffffffffffffde0,loc_05);
        in_stack_fffffffffffffd88 = local_190;
        in_stack_fffffffffffffd90 = pTStack_188;
        in_stack_fffffffffffffd98 = local_180;
        in_stack_fffffffffffffda0 = pLStack_178;
      }
      if ((NVar1 & VAL) != NOTYPE) {
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          trap_instruction();
        }
        Location::Location(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                           (size_t)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
        loc_06.super_LineCol.line = (size_t)in_stack_fffffffffffffdf8;
        loc_06.super_LineCol.offset = in_stack_fffffffffffffdf0;
        loc_06.super_LineCol.col = (size_t)in_stack_fffffffffffffe00;
        loc_06.name.str = (char *)in_stack_fffffffffffffe08;
        loc_06.name.len = in_stack_fffffffffffffe10;
        error<72ul>((char (*) [72])in_stack_fffffffffffffde0,loc_06);
        in_stack_fffffffffffffd88 = local_1b8;
        in_stack_fffffffffffffd90 = pTStack_1b0;
        in_stack_fffffffffffffd98 = local_1a8;
        in_stack_fffffffffffffda0 = pLStack_1a0;
      }
    }
  }
  else {
    if ((in_RDX & 8) != 0) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      Location::Location(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                         (size_t)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      loc.super_LineCol.line = (size_t)in_stack_fffffffffffffdf8;
      loc.super_LineCol.offset = in_stack_fffffffffffffdf0;
      loc.super_LineCol.col = (size_t)in_stack_fffffffffffffe00;
      loc.name.str = (char *)in_stack_fffffffffffffe08;
      loc.name.len = in_stack_fffffffffffffe10;
      error<72ul>((char (*) [72])in_stack_fffffffffffffde0,loc);
      in_stack_fffffffffffffd88 = local_a0;
      in_stack_fffffffffffffd90 = pTStack_98;
      in_stack_fffffffffffffd98 = local_90;
      in_stack_fffffffffffffda0 = pLStack_88;
    }
    if ((in_RDX & 1) != 0) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      Location::Location(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                         (size_t)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      loc_00.super_LineCol.line = (size_t)in_stack_fffffffffffffdf8;
      loc_00.super_LineCol.offset = in_stack_fffffffffffffdf0;
      loc_00.super_LineCol.col = (size_t)in_stack_fffffffffffffe00;
      loc_00.name.str = (char *)in_stack_fffffffffffffe08;
      loc_00.name.len = in_stack_fffffffffffffe10;
      error<72ul>((char (*) [72])in_stack_fffffffffffffde0,loc_00);
      in_stack_fffffffffffffd88 = local_c8;
      in_stack_fffffffffffffd90 = pTStack_c0;
      in_stack_fffffffffffffd98 = local_b8;
      in_stack_fffffffffffffda0 = pLStack_b0;
    }
    if ((NVar1 & SEQ) != NOTYPE) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      Location::Location(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                         (size_t)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      loc_01.super_LineCol.line = (size_t)in_stack_fffffffffffffdf8;
      loc_01.super_LineCol.offset = in_stack_fffffffffffffdf0;
      loc_01.super_LineCol.col = (size_t)in_stack_fffffffffffffe00;
      loc_01.name.str = (char *)in_stack_fffffffffffffe08;
      loc_01.name.len = in_stack_fffffffffffffe10;
      error<72ul>((char (*) [72])in_stack_fffffffffffffde0,loc_01);
      in_stack_fffffffffffffd88 = local_f0;
      in_stack_fffffffffffffd90 = pTStack_e8;
      in_stack_fffffffffffffd98 = local_e0;
      in_stack_fffffffffffffda0 = pLStack_d8;
    }
    if ((NVar1 & VAL) != NOTYPE) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      Location::Location(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                         (size_t)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      loc_02.super_LineCol.line = (size_t)in_stack_fffffffffffffdf8;
      loc_02.super_LineCol.offset = in_stack_fffffffffffffdf0;
      loc_02.super_LineCol.col = (size_t)in_stack_fffffffffffffe00;
      loc_02.name.str = (char *)in_stack_fffffffffffffe08;
      loc_02.name.len = in_stack_fffffffffffffe10;
      error<72ul>((char (*) [72])in_stack_fffffffffffffde0,loc_02);
      in_stack_fffffffffffffd88 = local_118;
      in_stack_fffffffffffffd90 = pTStack_110;
      in_stack_fffffffffffffd98 = local_108;
      in_stack_fffffffffffffda0 = pLStack_100;
    }
  }
  if ((in_RDX & 2) != 0) {
    bVar2 = is_root(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    if (bVar2) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      Location::Location(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                         (size_t)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      loc_07.super_LineCol.line = (size_t)in_stack_fffffffffffffdf8;
      loc_07.super_LineCol.offset = in_stack_fffffffffffffdf0;
      loc_07.super_LineCol.col = (size_t)in_stack_fffffffffffffe00;
      loc_07.name.str = (char *)in_stack_fffffffffffffe08;
      loc_07.name.len = in_stack_fffffffffffffe10;
      error<29ul>((char (*) [29])in_stack_fffffffffffffde0,loc_07);
      in_stack_fffffffffffffd88 = local_1e0;
      in_stack_fffffffffffffd90 = pTStack_1d8;
      in_stack_fffffffffffffd98 = local_1d0;
      in_stack_fffffffffffffda0 = pLStack_1c8;
    }
    parent(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    pNVar4 = _p(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    if (((pNVar4->m_type).type & MAP) == NOTYPE) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      Location::Location(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                         (size_t)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      in_stack_fffffffffffffda0 = in_stack_fffffffffffffe08;
      in_stack_fffffffffffffd98 = in_stack_fffffffffffffe00;
      in_stack_fffffffffffffd90 = in_stack_fffffffffffffdf8;
      in_stack_fffffffffffffd88 = in_stack_fffffffffffffdf0;
      loc_08.super_LineCol.line = (size_t)in_stack_fffffffffffffd90;
      loc_08.super_LineCol.offset = in_stack_fffffffffffffd88;
      loc_08.super_LineCol.col = (size_t)in_stack_fffffffffffffd98;
      loc_08.name.str = (char *)in_stack_fffffffffffffda0;
      loc_08.name.len = in_stack_fffffffffffffe10;
      in_stack_fffffffffffffdf0 = in_stack_fffffffffffffd88;
      in_stack_fffffffffffffdf8 = in_stack_fffffffffffffd90;
      in_stack_fffffffffffffe00 = in_stack_fffffffffffffd98;
      in_stack_fffffffffffffe08 = in_stack_fffffffffffffda0;
      error<26ul>((char (*) [26])in_stack_fffffffffffffde0,loc_08);
    }
  }
  if (((in_RDX & 1) != 0) &&
     (bVar2 = is_root(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8), !bVar2)) {
    parent(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    pNVar4 = _p(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    if ((((pNVar4->m_type).type & MAP) == NOTYPE) &&
       (pNVar4 = _p(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8),
       ((pNVar4->m_type).type & SEQ) == NOTYPE)) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      Location::Location(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                         (size_t)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      loc_09.super_LineCol.line = (size_t)in_stack_fffffffffffffdf8;
      loc_09.super_LineCol.offset = in_stack_fffffffffffffdf0;
      loc_09.super_LineCol.col = (size_t)in_stack_fffffffffffffe00;
      loc_09.name.str = (char *)in_stack_fffffffffffffe08;
      loc_09.name.len = in_stack_fffffffffffffe10;
      error<41ul>((char (*) [41])in_stack_fffffffffffffde0,loc_09);
    }
  }
  return;
}

Assistant:

void _check_next_flags(size_t node, type_bits f)
    {
        auto n = _p(node);
        type_bits o = n->m_type; // old
        C4_UNUSED(o);
        if(f & MAP)
        {
            RYML_ASSERT_MSG((f & SEQ) == 0, "cannot mark simultaneously as map and seq");
            RYML_ASSERT_MSG((f & VAL) == 0, "cannot mark simultaneously as map and val");
            RYML_ASSERT_MSG((o & SEQ) == 0, "cannot turn a seq into a map; clear first");
            RYML_ASSERT_MSG((o & VAL) == 0, "cannot turn a val into a map; clear first");
        }
        else if(f & SEQ)
        {
            RYML_ASSERT_MSG((f & MAP) == 0, "cannot mark simultaneously as seq and map");
            RYML_ASSERT_MSG((f & VAL) == 0, "cannot mark simultaneously as seq and val");
            RYML_ASSERT_MSG((o & MAP) == 0, "cannot turn a map into a seq; clear first");
            RYML_ASSERT_MSG((o & VAL) == 0, "cannot turn a val into a seq; clear first");
        }
        if(f & KEY)
        {
            RYML_ASSERT(!is_root(node));
            auto pid = parent(node); C4_UNUSED(pid);
            RYML_ASSERT(is_map(pid));
        }
        if((f & VAL) && !is_root(node))
        {
            auto pid = parent(node); C4_UNUSED(pid);
            RYML_ASSERT(is_map(pid) || is_seq(pid));
        }
    }